

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

bool __thiscall
QGraphicsProxyWidget::eventFilter(QGraphicsProxyWidget *this,QObject *object,QEvent *event)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  Type TVar4;
  QGraphicsProxyWidgetPrivate *this_00;
  QWidget *this_01;
  QEvent *in_RDX;
  QEvent *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QGraphicsProxyWidgetPrivate *d;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QWindow *in_stack_ffffffffffffff98;
  QGraphicsItem *in_stack_ffffffffffffffa0;
  QGraphicsProxyWidgetPrivate *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsProxyWidget *)0x9bba84);
  bVar2 = ::operator==((QObject **)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       (QPointer<QWidget> *)
                       CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  if (bVar2) {
    TVar4 = QEvent::type(in_RDX);
    if (TVar4 == Move) {
      if ((*(ushort *)&this_00->field_0x244 & 3) == 0) {
        QGraphicsProxyWidgetPrivate::updateProxyGeometryFromWidget(in_stack_ffffffffffffffa8);
      }
    }
    else if (TVar4 == Resize) {
      if ((*(ushort *)&this_00->field_0x244 >> 2 & 3) == 0) {
        QGraphicsProxyWidgetPrivate::updateProxyGeometryFromWidget(in_stack_ffffffffffffffa8);
      }
    }
    else if (TVar4 - Show < 2) {
      if ((*(ushort *)&this_00->field_0x244 >> 4 & 3) == 0) {
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xffcf | 0x20;
        QEvent::type(in_RDX);
        QGraphicsItem::setVisible
                  (in_stack_ffffffffffffffa0,SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xffcf;
      }
    }
    else if (TVar4 == LayoutRequest) {
      (**(code **)(*(long *)in_RDI + 0xa8))();
    }
    else if (TVar4 == EnabledChange) {
      if ((*(ushort *)&this_00->field_0x244 >> 6 & 3) == 0) {
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xff3f | 0x80;
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bbc5f);
        QWidget::isEnabled((QWidget *)0x9bbc67);
        QGraphicsItem::setEnabled
                  ((QGraphicsItem *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   (bool)in_stack_ffffffffffffff8f);
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xff3f;
      }
    }
    else if (TVar4 == StyleChange) {
      if ((*(ushort *)&this_00->field_0x244 >> 8 & 3) == 0) {
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xfcff | 0x200;
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bbce2);
        QWidget::style((QWidget *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
        QGraphicsWidget::setStyle
                  (in_stack_ffffffffffffff98,
                   (QStyle *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xfcff;
      }
    }
    else if ((TVar4 == ToolTipChange) && ((*(ushort *)&this_00->field_0x244 >> 0xc & 3) == 0)) {
      *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xcfff | 0x2000;
      this_01 = (QWidget *)(in_RDI + 0x10);
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bbd70);
      QWidget::toolTip(this_01);
      QGraphicsItem::setToolTip((QGraphicsItem *)this_00,(QString *)in_RDI);
      QString::~QString((QString *)0x9bbd96);
      *(ushort *)&this_00->field_0x244 = *(ushort *)&this_00->field_0x244 & 0xcfff;
    }
  }
  bVar3 = QObject::eventFilter(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool QGraphicsProxyWidget::eventFilter(QObject *object, QEvent *event)
{
    Q_D(QGraphicsProxyWidget);

    if (object == d->widget) {
        switch (event->type()) {
        case QEvent::LayoutRequest:
            updateGeometry();
            break;
         case QEvent::Resize:
             // If the widget resizes itself, we resize the proxy too.
             // Prevent feed-back by checking the geometry change mode.
             if (!d->sizeChangeMode)
                 d->updateProxyGeometryFromWidget();
            break;
         case QEvent::Move:
             // If the widget moves itself, we move the proxy too.  Prevent
             // feed-back by checking the geometry change mode.
             if (!d->posChangeMode)
                 d->updateProxyGeometryFromWidget();
            break;
        case QEvent::Hide:
        case QEvent::Show:
            // If the widget toggles its visible state, the proxy will follow.
            if (!d->visibleChangeMode) {
                d->visibleChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
                setVisible(event->type() == QEvent::Show);
                d->visibleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
            }
            break;
        case QEvent::EnabledChange:
            // If the widget toggles its enabled state, the proxy will follow.
            if (!d->enabledChangeMode) {
                d->enabledChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
                setEnabled(d->widget->isEnabled());
                d->enabledChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
            }
            break;
        case QEvent::StyleChange:
            // Propagate style changes to the proxy.
            if (!d->styleChangeMode) {
                d->styleChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
                setStyle(d->widget->style());
                d->styleChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
            }
            break;
#if QT_CONFIG(tooltip)
        case QEvent::ToolTipChange:
            // Propagate tooltip change to the proxy.
            if (!d->tooltipChangeMode) {
                d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::WidgetToProxyMode;
                setToolTip(d->widget->toolTip());
                d->tooltipChangeMode = QGraphicsProxyWidgetPrivate::NoMode;
            }
            break;
#endif
        default:
            break;
        }
    }
    return QGraphicsWidget::eventFilter(object, event);
}